

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayEqualFailureIncludesCheckExpectedAndActual::
TestCheckArrayEqualFailureIncludesCheckExpectedAndActual
          (TestCheckArrayEqualFailureIncludesCheckExpectedAndActual *this)

{
  char *suiteName;
  TestCheckArrayEqualFailureIncludesCheckExpectedAndActual *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckArrayEqualFailureIncludesCheckExpectedAndActual",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x202);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckArrayEqualFailureIncludesCheckExpectedAndActual_00183400;
  return;
}

Assistant:

TEST(CheckArrayEqualFailureIncludesCheckExpectedAndActual)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_EQUAL (data1, data2, 4);
    }

    CHECK(strstr(reporter.lastFailedMessage, "xpected [ 0 1 2 3 ]"));
    CHECK(strstr(reporter.lastFailedMessage, "was [ 0 1 3 3 ]"));
}